

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::ClosePopupsOverWindow(ImGuiWindow *ref_window)

{
  uint uVar1;
  int iVar2;
  value_type *pvVar3;
  int i;
  int m;
  int i_00;
  ImVector<ImGuiPopupRef> *this;
  bool bVar4;
  
  iVar2 = (GImGui->OpenPopupStack).Size;
  if (iVar2 != 0) {
    if (ref_window == (ImGuiWindow *)0x0) {
      i = 0;
    }
    else {
      this = &GImGui->OpenPopupStack;
      for (i = 0; i < iVar2; i = i + 1) {
        pvVar3 = ImVector<ImGuiPopupRef>::operator[](this,i);
        if (pvVar3->Window != (ImGuiWindow *)0x0) {
          uVar1 = pvVar3->Window->Flags;
          if ((uVar1 >> 0x1a & 1) == 0) {
            __assert_fail("(popup.Window->Flags & ImGuiWindowFlags_Popup) != 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                          ,0x1375,"void ImGui::ClosePopupsOverWindow(ImGuiWindow *)");
          }
          if ((uVar1 >> 0x18 & 1) == 0) {
            bVar4 = false;
            i_00 = i;
            while ((iVar2 = this->Size, i_00 < iVar2 && (!bVar4))) {
              pvVar3 = ImVector<ImGuiPopupRef>::operator[](this,i_00);
              if (pvVar3->Window == (ImGuiWindow *)0x0) {
                bVar4 = false;
              }
              else {
                pvVar3 = ImVector<ImGuiPopupRef>::operator[](this,i_00);
                bVar4 = pvVar3->Window->RootWindow == ref_window->RootWindow;
              }
              i_00 = i_00 + 1;
            }
            if (!bVar4) break;
          }
        }
        iVar2 = this->Size;
      }
    }
    if (i < iVar2) {
      ClosePopupToLevel(i);
      return;
    }
  }
  return;
}

Assistant:

void ImGui::ClosePopupsOverWindow(ImGuiWindow* ref_window)
{
    ImGuiContext& g = *GImGui;
    if (g.OpenPopupStack.empty())
        return;

    // When popups are stacked, clicking on a lower level popups puts focus back to it and close popups above it.
    // Don't close our own child popup windows.
    int n = 0;
    if (ref_window)
    {
        for (n = 0; n < g.OpenPopupStack.Size; n++)
        {
            ImGuiPopupRef& popup = g.OpenPopupStack[n];
            if (!popup.Window)
                continue;
            IM_ASSERT((popup.Window->Flags & ImGuiWindowFlags_Popup) != 0);
            if (popup.Window->Flags & ImGuiWindowFlags_ChildWindow)
                continue;

            // Trim the stack if popups are not direct descendant of the reference window (which is often the NavWindow)
            bool has_focus = false;
            for (int m = n; m < g.OpenPopupStack.Size && !has_focus; m++)
                has_focus = (g.OpenPopupStack[m].Window && g.OpenPopupStack[m].Window->RootWindow == ref_window->RootWindow);
            if (!has_focus)
                break;
        }
    }
    if (n < g.OpenPopupStack.Size) // This test is not required but it allows to set a convenient breakpoint on the block below
        ClosePopupToLevel(n);
}